

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O3

void httplib::detail::split(char *b,char *e,char d,function<void_(const_char_*,_const_char_*)> *fn)

{
  char *pcVar1;
  ulong uVar2;
  char cVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  char *local_48;
  char *local_40;
  ulong local_38;
  
  uVar5 = (long)e - (long)b;
  uVar6 = 0;
  uVar7 = uVar6;
LAB_00143003:
  pcVar1 = b + uVar7;
  if (e == (char *)0x0) {
    cVar3 = *pcVar1;
    if (cVar3 == '\0') goto LAB_001430b7;
  }
  else {
    if (e <= pcVar1) goto LAB_001430b7;
    cVar3 = *pcVar1;
  }
  uVar2 = uVar6;
  if (cVar3 == d) {
    for (; (uVar4 = uVar7, b + uVar2 < e && ((b[uVar2] == ' ' || (uVar6 = uVar2, b[uVar2] == '\t')))
           ); uVar2 = uVar2 + 1) {
      uVar6 = uVar5;
    }
    for (; uVar4 != 0; uVar4 = uVar4 - 1) {
      if ((b[uVar4 - 1] != ' ') && (b[uVar4 - 1] != '\t')) goto LAB_00143076;
    }
    uVar4 = 0;
LAB_00143076:
    if (uVar6 < uVar4) {
      local_40 = b + uVar6;
      local_48 = b + uVar4;
      local_38 = uVar5;
      if ((fn->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_00143137;
      (*fn->_M_invoker)((_Any_data *)fn,&local_40,&local_48);
      uVar5 = local_38;
    }
    uVar6 = uVar7 + 1;
    uVar7 = uVar6;
  }
  else {
    uVar7 = uVar7 + 1;
  }
  goto LAB_00143003;
LAB_001430b7:
  uVar2 = uVar6;
  if (uVar7 != 0) {
    for (; (b + uVar2 < e && ((b[uVar2] == ' ' || (uVar6 = uVar2, b[uVar2] == '\t'))));
        uVar2 = uVar2 + 1) {
      uVar6 = uVar5;
    }
    do {
      if ((b[uVar7 - 1] != ' ') && (b[uVar7 - 1] != '\t')) goto LAB_001430fe;
      uVar7 = uVar7 - 1;
    } while (uVar7 != 0);
    uVar7 = 0;
LAB_001430fe:
    if (uVar6 < uVar7) {
      local_40 = b + uVar6;
      local_48 = b + uVar7;
      if ((fn->super__Function_base)._M_manager == (_Manager_type)0x0) {
LAB_00143137:
        std::__throw_bad_function_call();
      }
      (*fn->_M_invoker)((_Any_data *)fn,&local_40,&local_48);
    }
  }
  return;
}

Assistant:

inline void split(const char *b, const char *e, char d,
                  std::function<void(const char *, const char *)> fn) {
  size_t i = 0;
  size_t beg = 0;

  while (e ? (b + i < e) : (b[i] != '\0')) {
    if (b[i] == d) {
      auto r = trim(b, e, beg, i);
      if (r.first < r.second) { fn(&b[r.first], &b[r.second]); }
      beg = i + 1;
    }
    i++;
  }

  if (i) {
    auto r = trim(b, e, beg, i);
    if (r.first < r.second) { fn(&b[r.first], &b[r.second]); }
  }
}